

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcSymLocal * __thiscall
CTcPrsSymtab::add_formal(CTcPrsSymtab *this,textchar_t *sym,size_t len,int formal_num,int copy_str)

{
  int iVar1;
  undefined4 extraout_var;
  CTcSymLocalBase *this_00;
  
  iVar1 = (*this->_vptr_CTcPrsSymtab[2])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this_00 = (CTcSymLocalBase *)CTcPrsMem::alloc(G_prsmem,0x68);
    CTcSymLocalBase::CTcSymLocalBase(this_00,sym,len,copy_str,1,formal_num);
    (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
    _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00363b30;
    (*this->_vptr_CTcPrsSymtab[3])(this,this_00);
  }
  else {
    this_00 = (CTcSymLocalBase *)0x0;
    CTcTokenizer::log_error(0x2b1f,len & 0xffffffff,sym);
  }
  return (CTcSymLocal *)this_00;
}

Assistant:

CTcSymLocal *CTcPrsSymtab::add_formal(const textchar_t *sym, size_t len,
                                      int formal_num, int copy_str)
{
    CTcSymLocal *lcl;
    
    /* 
     *   Make sure it's not already defined in our own symbol table - if
     *   it is, log an error and ignore the redundant definition.  (We
     *   only care about our own scope, not enclosing scopes, since it's
     *   perfectly fine to hide variables in enclosing scopes.)  
     */
    if (find_direct(sym, len) != 0)
    {
        /* log an error */
        G_tok->log_error(TCERR_FORMAL_REDEF, (int)len, sym);

        /* don't add the symbol again */
        return 0;
    }

    /* create the symbol entry */
    lcl = new CTcSymLocal(sym, len, copy_str, TRUE, formal_num);

    /* add it to the table */
    add_entry(lcl);

    /* return the new symbol */
    return lcl;
}